

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine.cpp
# Opt level: O1

int __thiscall QFSFileEngine::copy(QFSFileEngine *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  QAbstractFileEnginePrivate *pQVar1;
  bool bVar2;
  undefined7 extraout_var;
  long in_FS_OFFSET;
  QSystemError error;
  QSystemError local_68;
  QFileSystemEntry local_60;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QAbstractFileEngine).d_ptr.d;
  local_68.errorCode = 0;
  local_68.errorScope = NoError;
  QFileSystemEntry::QFileSystemEntry(&local_60,(QString *)dst);
  bVar2 = QFileSystemEngine::copyFile((QFileSystemEntry *)(pQVar1 + 1),&local_60,&local_68);
  if (&(local_60.m_nativeFilePath.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_60.m_nativeFilePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
         = ((local_60.m_nativeFilePath.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_60.m_nativeFilePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
        _M_i == 0) {
      QArrayData::deallocate(&(local_60.m_nativeFilePath.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_60.m_filePath.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_60.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_60.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_60.m_filePath.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (!bVar2) {
    QSystemError::string(&local_60.m_filePath,local_68.errorScope,local_68.errorCode);
    QAbstractFileEngine::setError(&this->super_QAbstractFileEngine,CopyError,&local_60.m_filePath);
    if (&(local_60.m_filePath.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_60.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_60.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_60.m_filePath.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (int)CONCAT71(extraout_var,bVar2);
  }
  __stack_chk_fail();
}

Assistant:

bool QFSFileEngine::copy(const QString &copyName)
{
    Q_D(QFSFileEngine);
    QSystemError error;
    bool ret = QFileSystemEngine::copyFile(d->fileEntry, QFileSystemEntry(copyName), error);
    if (!ret)
        setError(QFile::CopyError, error.toString());
    return ret;
}